

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteMainCMakefile(cmGlobalUnixMakefileGenerator3 *this)

{
  cmLocalGenerator *pcVar1;
  byte bVar2;
  bool bVar3;
  cmake *pcVar4;
  char *pcVar5;
  reference ppcVar6;
  ostream *poVar7;
  ulong uVar8;
  size_type sVar9;
  cmMakefile *pcVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar11;
  const_iterator __first;
  const_iterator __last;
  iterator iVar12;
  iterator iVar13;
  reference pbVar14;
  string local_4e8;
  uint local_4c4;
  undefined1 local_4c0 [4];
  uint i_2;
  string tmpStr;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_480;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_478;
  const_iterator k;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *outfiles;
  string local_448;
  allocator local_421;
  undefined1 local_420 [8];
  string check;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3e0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3d8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3d0;
  const_iterator i_1;
  allocator local_3a1;
  undefined1 local_3a0 [8];
  string cache;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_378;
  const_iterator local_370;
  const_iterator local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_360;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_358;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_350;
  iterator new_end;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_318;
  const_iterator local_310;
  uint local_304;
  undefined1 local_300 [4];
  uint i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lfiles;
  cmLocalUnixMakefileGenerator3 *lg;
  undefined1 local_2b8 [8];
  string makefileName;
  undefined1 local_290 [8];
  cmGeneratedFileStream cmakefileStream;
  allocator local_31;
  string local_30 [8];
  string cmakefileName;
  cmGlobalUnixMakefileGenerator3 *this_local;
  
  cmakefileName.field_2._8_8_ = this;
  pcVar4 = cmGlobalGenerator::GetCMakeInstance(&this->super_cmGlobalGenerator);
  pcVar5 = cmake::GetHomeOutputDirectory(pcVar4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,pcVar5,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  pcVar5 = cmake::GetCMakeFilesDirectory();
  std::__cxx11::string::operator+=(local_30,pcVar5);
  std::__cxx11::string::operator+=(local_30,"/Makefile.cmake");
  pcVar5 = (char *)std::__cxx11::string::c_str();
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_290,pcVar5,false);
  bVar2 = std::ios::operator!((ios *)(local_290 + (long)*(_func_int **)((long)local_290 + -0x18)));
  if ((bVar2 & 1) == 0) {
    pcVar4 = cmGlobalGenerator::GetCMakeInstance(&this->super_cmGlobalGenerator);
    pcVar5 = cmake::GetHomeOutputDirectory(pcVar4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_2b8,pcVar5,(allocator *)((long)&lg + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&lg + 7));
    std::__cxx11::string::operator+=((string *)local_2b8,"/Makefile");
    ppcVar6 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                        (&(this->super_cmGlobalGenerator).LocalGenerators,0);
    cmLocalUnixMakefileGenerator3::WriteDisclaimer
              ((cmLocalUnixMakefileGenerator3 *)*ppcVar6,(ostream *)local_290);
    poVar7 = std::operator<<((ostream *)local_290,"# The generator used is:\n");
    poVar7 = std::operator<<(poVar7,"set(CMAKE_DEPENDS_GENERATOR \"");
    (*(this->super_cmGlobalGenerator)._vptr_cmGlobalGenerator[2])
              (&lfiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    poVar7 = std::operator<<(poVar7,(string *)
                                    &lfiles.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::operator<<(poVar7,"\")\n\n");
    std::__cxx11::string::~string
              ((string *)
               &lfiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_300);
    local_304 = 0;
    while( true ) {
      uVar8 = (ulong)local_304;
      sVar9 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::size
                        (&(this->super_cmGlobalGenerator).LocalGenerators);
      if (sVar9 <= uVar8) break;
      ppcVar6 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                          (&(this->super_cmGlobalGenerator).LocalGenerators,(ulong)local_304);
      pcVar1 = *ppcVar6;
      local_318._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_300);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_310,&local_318);
      pcVar10 = cmLocalGenerator::GetMakefile(pcVar1);
      pvVar11 = cmMakefile::GetListFiles_abi_cxx11_(pcVar10);
      __first = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin(pvVar11);
      pcVar10 = cmLocalGenerator::GetMakefile(pcVar1);
      pvVar11 = cmMakefile::GetListFiles_abi_cxx11_(pcVar10);
      __last = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(pvVar11);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_300,
                 local_310,
                 (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )__first._M_current,
                 (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )__last._M_current);
      local_304 = local_304 + 1;
    }
    iVar12 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_300);
    iVar13 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_300);
    std::
    sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::less<std::__cxx11::string>>
              (iVar12._M_current,iVar13._M_current);
    local_358._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_300);
    local_360 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_300);
    local_350 = std::
                unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                          (local_358,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )local_360);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_368,&local_350);
    local_378._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_300);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_370,&local_378);
    cache.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_300,local_368,local_370);
    ppcVar6 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                        (&(this->super_cmGlobalGenerator).LocalGenerators,0);
    pcVar1 = *ppcVar6;
    pcVar4 = cmGlobalGenerator::GetCMakeInstance(&this->super_cmGlobalGenerator);
    pcVar5 = cmake::GetHomeOutputDirectory(pcVar4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_3a0,pcVar5,&local_3a1);
    std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
    std::__cxx11::string::operator+=((string *)local_3a0,"/CMakeCache.txt");
    poVar7 = std::operator<<((ostream *)local_290,
                             "# The top level Makefile was generated from the following files:\n");
    poVar7 = std::operator<<(poVar7,"set(CMAKE_MAKEFILE_DEPENDS\n");
    poVar7 = std::operator<<(poVar7,"  \"");
    cmOutputConverter::Convert
              ((string *)&i_1,&pcVar1->super_cmOutputConverter,(string *)local_3a0,START_OUTPUT,
               UNCHANGED);
    poVar7 = std::operator<<(poVar7,(string *)&i_1);
    std::operator<<(poVar7,"\"\n");
    std::__cxx11::string::~string((string *)&i_1);
    local_3d8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_300);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_3d0,&local_3d8);
    while( true ) {
      local_3e0._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_300);
      bVar3 = __gnu_cxx::operator!=(&local_3d0,&local_3e0);
      if (!bVar3) break;
      poVar7 = std::operator<<((ostream *)local_290,"  \"");
      pbVar14 = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&local_3d0);
      cmOutputConverter::Convert
                ((string *)((long)&check.field_2 + 8),&pcVar1->super_cmOutputConverter,pbVar14,
                 START_OUTPUT,UNCHANGED);
      poVar7 = std::operator<<(poVar7,(string *)(check.field_2._M_local_buf + 8));
      std::operator<<(poVar7,"\"\n");
      std::__cxx11::string::~string((string *)(check.field_2._M_local_buf + 8));
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_3d0);
    }
    std::operator<<((ostream *)local_290,"  )\n\n");
    pcVar4 = cmGlobalGenerator::GetCMakeInstance(&this->super_cmGlobalGenerator);
    pcVar5 = cmake::GetHomeOutputDirectory(pcVar4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_420,pcVar5,&local_421);
    std::allocator<char>::~allocator((allocator<char> *)&local_421);
    pcVar5 = cmake::GetCMakeFilesDirectory();
    std::__cxx11::string::operator+=((string *)local_420,pcVar5);
    std::__cxx11::string::operator+=((string *)local_420,"/cmake.check_cache");
    poVar7 = std::operator<<((ostream *)local_290,"# The corresponding makefile is:\n");
    poVar7 = std::operator<<(poVar7,"set(CMAKE_MAKEFILE_OUTPUTS\n");
    poVar7 = std::operator<<(poVar7,"  \"");
    cmOutputConverter::Convert
              (&local_448,&pcVar1->super_cmOutputConverter,(string *)local_2b8,START_OUTPUT,
               UNCHANGED);
    poVar7 = std::operator<<(poVar7,(string *)&local_448);
    poVar7 = std::operator<<(poVar7,"\"\n");
    poVar7 = std::operator<<(poVar7,"  \"");
    cmOutputConverter::Convert
              ((string *)&outfiles,&pcVar1->super_cmOutputConverter,(string *)local_420,START_OUTPUT
               ,UNCHANGED);
    poVar7 = std::operator<<(poVar7,(string *)&outfiles);
    std::operator<<(poVar7,"\"\n");
    std::__cxx11::string::~string((string *)&outfiles);
    std::__cxx11::string::~string((string *)&local_448);
    std::operator<<((ostream *)local_290,"  )\n\n");
    poVar7 = std::operator<<((ostream *)local_290,"# Byproducts of CMake generate step:\n");
    std::operator<<(poVar7,"set(CMAKE_MAKEFILE_PRODUCTS\n");
    pcVar10 = cmLocalGenerator::GetMakefile(pcVar1);
    k._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   cmMakefile::GetOutputFiles_abi_cxx11_(pcVar10);
    local_478._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)k._M_current);
    while( true ) {
      local_480._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(k._M_current);
      bVar3 = __gnu_cxx::operator!=(&local_478,&local_480);
      if (!bVar3) break;
      poVar7 = std::operator<<((ostream *)local_290,"  \"");
      pbVar14 = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&local_478);
      cmOutputConverter::Convert
                ((string *)((long)&tmpStr.field_2 + 8),&pcVar1->super_cmOutputConverter,pbVar14,
                 HOME_OUTPUT,UNCHANGED);
      poVar7 = std::operator<<(poVar7,(string *)(tmpStr.field_2._M_local_buf + 8));
      std::operator<<(poVar7,"\"\n");
      std::__cxx11::string::~string((string *)(tmpStr.field_2._M_local_buf + 8));
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_478);
    }
    std::__cxx11::string::string((string *)local_4c0);
    local_4c4 = 0;
    while( true ) {
      uVar8 = (ulong)local_4c4;
      sVar9 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::size
                        (&(this->super_cmGlobalGenerator).LocalGenerators);
      if (sVar9 <= uVar8) break;
      ppcVar6 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                          (&(this->super_cmGlobalGenerator).LocalGenerators,(ulong)local_4c4);
      pcVar1 = *ppcVar6;
      pcVar10 = cmLocalGenerator::GetMakefile(pcVar1);
      pcVar5 = cmMakefile::GetCurrentBinaryDirectory(pcVar10);
      std::__cxx11::string::operator=((string *)local_4c0,pcVar5);
      pcVar5 = cmake::GetCMakeFilesDirectory();
      std::__cxx11::string::operator+=((string *)local_4c0,pcVar5);
      std::__cxx11::string::operator+=((string *)local_4c0,"/CMakeDirectoryInformation.cmake");
      poVar7 = std::operator<<((ostream *)local_290,"  \"");
      cmOutputConverter::Convert
                (&local_4e8,&pcVar1->super_cmOutputConverter,(string *)local_4c0,HOME_OUTPUT,
                 UNCHANGED);
      poVar7 = std::operator<<(poVar7,(string *)&local_4e8);
      std::operator<<(poVar7,"\"\n");
      std::__cxx11::string::~string((string *)&local_4e8);
      local_4c4 = local_4c4 + 1;
    }
    std::operator<<((ostream *)local_290,"  )\n\n");
    std::__cxx11::string::~string((string *)local_4c0);
    WriteMainCMakefileLanguageRules
              (this,(cmGeneratedFileStream *)local_290,
               &(this->super_cmGlobalGenerator).LocalGenerators);
    std::__cxx11::string::~string((string *)local_420);
    std::__cxx11::string::~string((string *)local_3a0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_300);
    std::__cxx11::string::~string((string *)local_2b8);
    makefileName.field_2._12_4_ = 0;
  }
  else {
    makefileName.field_2._12_4_ = 1;
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_290);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::WriteMainCMakefile()
{
  // Open the output file.  This should not be copy-if-different
  // because the check-build-system step compares the makefile time to
  // see if the build system must be regenerated.
  std::string cmakefileName =
    this->GetCMakeInstance()->GetHomeOutputDirectory();
  cmakefileName += cmake::GetCMakeFilesDirectory();
  cmakefileName += "/Makefile.cmake";
  cmGeneratedFileStream cmakefileStream(cmakefileName.c_str());
  if(!cmakefileStream)
    {
    return;
    }

  std::string makefileName =
    this->GetCMakeInstance()->GetHomeOutputDirectory();
  makefileName += "/Makefile";

  // get a local generator for some useful methods
  cmLocalUnixMakefileGenerator3 *lg =
    static_cast<cmLocalUnixMakefileGenerator3 *>(this->LocalGenerators[0]);

  // Write the do not edit header.
  lg->WriteDisclaimer(cmakefileStream);

  // Save the generator name
  cmakefileStream
    << "# The generator used is:\n"
    << "set(CMAKE_DEPENDS_GENERATOR \"" << this->GetName() << "\")\n\n";

  // for each cmMakefile get its list of dependencies
  std::vector<std::string> lfiles;
  for (unsigned int i = 0; i < this->LocalGenerators.size(); ++i)
    {
    lg =
      static_cast<cmLocalUnixMakefileGenerator3 *>(this->LocalGenerators[i]);

    // Get the list of files contributing to this generation step.
    lfiles.insert(lfiles.end(),lg->GetMakefile()->GetListFiles().begin(),
                  lg->GetMakefile()->GetListFiles().end());
    }
  // Sort the list and remove duplicates.
  std::sort(lfiles.begin(), lfiles.end(), std::less<std::string>());
#if !defined(__VMS) // The Compaq STL on VMS crashes, so accept duplicates.
  std::vector<std::string>::iterator new_end =
    std::unique(lfiles.begin(),lfiles.end());
  lfiles.erase(new_end, lfiles.end());
#endif

  // reset lg to the first makefile
  lg = static_cast<cmLocalUnixMakefileGenerator3 *>(this->LocalGenerators[0]);

  // Build the path to the cache file.
  std::string cache = this->GetCMakeInstance()->GetHomeOutputDirectory();
  cache += "/CMakeCache.txt";

  // Save the list to the cmake file.
  cmakefileStream
    << "# The top level Makefile was generated from the following files:\n"
    << "set(CMAKE_MAKEFILE_DEPENDS\n"
    << "  \""
    << lg->Convert(cache,
                   cmLocalGenerator::START_OUTPUT) << "\"\n";
  for(std::vector<std::string>::const_iterator i = lfiles.begin();
      i !=  lfiles.end(); ++i)
    {
    cmakefileStream
      << "  \""
      << lg->Convert(*i, cmLocalGenerator::START_OUTPUT)
      << "\"\n";
    }
  cmakefileStream
    << "  )\n\n";

  // Build the path to the cache check file.
  std::string check = this->GetCMakeInstance()->GetHomeOutputDirectory();
  check += cmake::GetCMakeFilesDirectory();
  check += "/cmake.check_cache";

  // Set the corresponding makefile in the cmake file.
  cmakefileStream
    << "# The corresponding makefile is:\n"
    << "set(CMAKE_MAKEFILE_OUTPUTS\n"
    << "  \""
    << lg->Convert(makefileName,
                   cmLocalGenerator::START_OUTPUT) << "\"\n"
    << "  \""
    << lg->Convert(check,
                   cmLocalGenerator::START_OUTPUT) << "\"\n";
  cmakefileStream << "  )\n\n";

  // CMake must rerun if a byproduct is missing.
  {
  cmakefileStream
    << "# Byproducts of CMake generate step:\n"
    << "set(CMAKE_MAKEFILE_PRODUCTS\n";
  const std::vector<std::string>& outfiles =
    lg->GetMakefile()->GetOutputFiles();
  for(std::vector<std::string>::const_iterator k = outfiles.begin();
      k != outfiles.end(); ++k)
    {
    cmakefileStream << "  \"" <<
      lg->Convert(*k,cmLocalGenerator::HOME_OUTPUT)
                    << "\"\n";
    }

  // add in all the directory information files
  std::string tmpStr;
  for (unsigned int i = 0; i < this->LocalGenerators.size(); ++i)
    {
    lg =
      static_cast<cmLocalUnixMakefileGenerator3 *>(this->LocalGenerators[i]);
    tmpStr = lg->GetMakefile()->GetCurrentBinaryDirectory();
    tmpStr += cmake::GetCMakeFilesDirectory();
    tmpStr += "/CMakeDirectoryInformation.cmake";
    cmakefileStream << "  \"" <<
      lg->Convert(tmpStr,cmLocalGenerator::HOME_OUTPUT)
                    << "\"\n";
    }
  cmakefileStream << "  )\n\n";
  }

  this->WriteMainCMakefileLanguageRules(cmakefileStream,
                                        this->LocalGenerators);
}